

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcEllipseProfileDef::~IfcEllipseProfileDef(IfcEllipseProfileDef *this)

{
  ~IfcEllipseProfileDef
            ((IfcEllipseProfileDef *)
             &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
              _M_string_length);
  return;
}

Assistant:

IfcEllipseProfileDef() : Object("IfcEllipseProfileDef") {}